

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

void __thiscall
spvtools::opt::Loop::GetMergingBlocks
          (Loop *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *merging_blocks)

{
  IRContext *this_00;
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint32_t blk_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  size_type sVar6;
  mapped_type *ppBVar7;
  _Elt_pointer ppBVar8;
  __hashtable *__h;
  uint32_t *puVar9;
  uint32_t pred_id;
  stack<const_spvtools::opt::BasicBlock_*,_std::deque<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>_>
  to_visit;
  uint32_t local_a4;
  mapped_type local_a0;
  CFG *local_98;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_90;
  _Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
  local_88;
  
  if (this->loop_merge_ != (BasicBlock *)0x0) {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(this_00);
    }
    local_98 = (this_00->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&merging_blocks->_M_h);
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
    ::_M_initialize_map(&local_88,0);
    local_a0 = this->loop_merge_;
    std::deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>::
    emplace_back<spvtools::opt::BasicBlock_const*>
              ((deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
                *)&local_88,&local_a0);
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_90 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&local_98->id2block_;
      do {
        ppBVar8 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppBVar8 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        pBVar1 = ppBVar8[-1];
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        pIVar2 = (pBVar1->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        blk_id = 0;
        uVar4 = 0;
        if (pIVar2->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
        }
        local_a4 = uVar4;
        local_a0 = (mapped_type)merging_blocks;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (merging_blocks,
                   (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_a4,&local_a0);
        pIVar2 = (pBVar1->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if (pIVar2->has_result_id_ == true) {
          blk_id = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
        }
        pvVar5 = CFG::preds(local_98,blk_id);
        puVar3 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar9 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3;
            puVar9 = puVar9 + 1) {
          local_a4 = *puVar9;
          local_a0 = (mapped_type)CONCAT44(local_a0._4_4_,local_a4);
          sVar6 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&(this->loop_basic_blocks_)._M_h,(key_type_conflict *)&local_a0);
          if (sVar6 == 0) {
            sVar6 = std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&merging_blocks->_M_h,(key_type_conflict *)&local_a4);
            if (sVar6 == 0) {
              local_a0 = (mapped_type)CONCAT44(local_a0._4_4_,local_a4);
              ppBVar7 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at(local_90,(key_type *)&local_a0);
              local_a0 = *ppBVar7;
              std::
              deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
              ::emplace_back<spvtools::opt::BasicBlock_const*>
                        ((deque<spvtools::opt::BasicBlock_const*,std::allocator<spvtools::opt::BasicBlock_const*>>
                          *)&local_88,&local_a0);
            }
          }
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::
    _Deque_base<const_spvtools::opt::BasicBlock_*,_std::allocator<const_spvtools::opt::BasicBlock_*>_>
    ::~_Deque_base(&local_88);
    return;
  }
  __assert_fail("GetMergeBlock() && \"This loop is not structured\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0x170,
                "void spvtools::opt::Loop::GetMergingBlocks(std::unordered_set<uint32_t> *) const");
}

Assistant:

void Loop::GetMergingBlocks(
    std::unordered_set<uint32_t>* merging_blocks) const {
  assert(GetMergeBlock() && "This loop is not structured");
  CFG* cfg = context_->cfg();
  merging_blocks->clear();

  std::stack<const BasicBlock*> to_visit;
  to_visit.push(GetMergeBlock());
  while (!to_visit.empty()) {
    const BasicBlock* bb = to_visit.top();
    to_visit.pop();
    merging_blocks->insert(bb->id());
    for (uint32_t pred_id : cfg->preds(bb->id())) {
      if (!IsInsideLoop(pred_id) && !merging_blocks->count(pred_id)) {
        to_visit.push(cfg->block(pred_id));
      }
    }
  }
}